

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O3

void tcmalloc::LLA_SkiplistInsert(AllocList *head,AllocList *e,AllocList **prev)

{
  bool bVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  AllocList *p;
  int iVar6;
  AllocList *pAVar7;
  AllocList *pAVar8;
  
  iVar6 = head->levels;
  lVar2 = (long)iVar6;
  lVar4 = lVar2;
  pAVar7 = head;
  if (0 < lVar2) {
    do {
      do {
        pAVar8 = pAVar7;
        pAVar7 = pAVar8->next[lVar4 + -1];
        if (pAVar7 == (AllocList *)0x0) break;
      } while (pAVar7 < e);
      prev[lVar4 + -1] = pAVar8;
      bVar1 = 1 < lVar4;
      lVar4 = lVar4 + -1;
      pAVar7 = pAVar8;
    } while (bVar1);
  }
  uVar3 = e->levels;
  if (iVar6 < (int)uVar3) {
    do {
      iVar6 = iVar6 + 1;
      prev[lVar2] = head;
      lVar2 = lVar2 + 1;
      head->levels = iVar6;
      uVar3 = e->levels;
    } while (lVar2 < (int)uVar3);
  }
  if (uVar3 != 0) {
    uVar5 = 0;
    do {
      e->next[uVar5] = prev[uVar5]->next[uVar5];
      prev[uVar5]->next[uVar5] = e;
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  return;
}

Assistant:

static AllocList *LLA_SkiplistSearch(AllocList *head,
                                     AllocList *e, AllocList **prev) {
  AllocList *p = head;
  for (int level = head->levels - 1; level >= 0; level--) {
    for (AllocList *n; (n = p->next[level]) != 0 && n < e; p = n) {
    }
    prev[level] = p;
  }
  return (head->levels == 0) ?  0 : prev[0]->next[0];
}